

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Mutable<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
          (RepeatedPtrFieldBase *this,int index)

{
  Type *pTVar1;
  int in_ESI;
  long in_RDI;
  
  pTVar1 = cast<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                     (*(void **)(*(long *)(in_RDI + 0x10) + 8 + (long)in_ESI * 8));
  return pTVar1;
}

Assistant:

inline typename TypeHandler::Type* RepeatedPtrFieldBase::Mutable(int index) {
  GOOGLE_DCHECK_GE(index, 0);
  GOOGLE_DCHECK_LT(index, current_size_);
  return cast<TypeHandler>(rep_->elements[index]);
}